

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test::TestBody
          (cfdcapi_elements_transaction_BlindDestroyAmountTransaction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  int ret;
  void *blind_handle;
  AssertionResult gtest_ar;
  void *handle;
  char *tx_string;
  char *pcVar3;
  char *s1;
  char *s2_expression;
  char *s1_expression;
  AssertHelper local_70;
  AssertHelper local_68;
  int local_5c;
  AssertHelper local_58;
  string local_50;
  void *local_30;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_30 = (void *)0x0;
  local_5c = CfdCreateHandle(&local_30);
  local_20.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_20.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_20,&local_5c);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_20);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x423,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_20.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_20.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_20.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20.ptr_._0_1_ = local_30 != (void *)0x0;
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30 == (void *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&local_20,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x424,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                       (char)local_50._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p));
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58.data_ = (AssertHelperData *)0x0;
  local_5c = CfdInitializeBlindTx(local_30,&local_58.data_);
  local_70.data_ = (AssertHelperData *)((ulong)local_70.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_5c);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x42c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_5c == 0) {
    local_5c = CfdAddBlindTxInData(local_30,local_58.data_,
                                   "eab064fc768dfb336537dace1a8953f5881f5792ec4d3099b42f4fb35bd2d10f"
                                   ,0,
                                   "d209585084f73d815926859c8f234dff59615344045d212a93c7d080093dbdc7"
                                   ,
                                   "44c2852117c44c7a43833d5a681f09ec6120d889bb70891627d30a122ff24047"
                                   ,
                                   "3a2916b1ddd3514b32c533116e02b1262fc9df455df55d82a30197f4a81e9580"
                                   ,1000000,(char *)0x0,(char *)0x0);
    local_70.data_ = local_70.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_5c);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x437,pcVar3);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_70.data_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_70.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_5c == 0) {
      s2_expression = (char *)0x0;
      s1_expression = (char *)0x0;
      pcVar3 = "32633edc9ed7acc9407935db0820921abdc446a7c0c0203d279740fc0b26425b";
      s1 = (char *)0x2710;
      local_5c = CfdAddBlindTxInData(local_30,local_58.data_,
                                     "4a1eca2eedf23ec40aaf45392afc6536c7cf1740d077bf468aaa7200c087b7d2"
                                     ,1,
                                     "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
                                     ,
                                     "7afdad5199ae3427783bca4e392ece8525431ec3345d08e231de7fa6bd4938ab"
                                     ,
                                     "32633edc9ed7acc9407935db0820921abdc446a7c0c0203d279740fc0b26425b"
                                     ,10000,(char *)0x0,(char *)0x0);
      local_70.data_ = local_70.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_5c);
      if ((char)local_50._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_70);
        if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)local_50._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x443,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if (local_70.data_ != (AssertHelperData *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_70.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_50._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_5c == 0) {
        local_5c = CfdFinalizeBlindTx(local_30,local_58.data_,
                                      "0200000000020fd1d25bb34f2fb499304dec92571f88f553891aceda376533fb8d76fc64b0ea0000000000ffffffffd2b787c00072aa8a46bf77d04017cfc73665fc2a3945af0ac43ef2ed2eca1e4a0100000000ffffffff0301c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d20100000000000f424000016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000001c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d201000000000000000003edd71a5d0cd1e82e48ec3e26bfbfecb053b2a196e3ce56752312cc81e7eaca72016a00000000"
                                      ,(char **)&local_20);
        local_70.data_ = local_70.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_5c);
        if ((char)local_50._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_70);
          if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)local_50._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x448,pcVar2);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_70.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_70.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_50._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        testing::internal::CmpHelperSTRNE(s1_expression,s2_expression,s1,pcVar3);
        if ((char)local_50._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_70);
          if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_50._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x449,pcVar3);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if (local_70.data_ != (AssertHelperData *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_70.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_50._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  if (local_58.data_ != (AssertHelperData *)0x0) {
    CfdFreeBlindHandle(local_30,local_58.data_);
  }
  CfdFreeStringBuffer((char *)local_20.ptr_);
  local_5c = CfdGetLastErrorCode(local_30);
  if (local_5c != 0) {
    local_70.data_ = (AssertHelperData *)0x0;
    local_5c = CfdGetLastErrorMessage(local_30,(char **)&local_70);
    local_68.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&local_5c);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x456,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar3 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_50,"\"\"","str_buffer","",(char *)local_70.data_);
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
        pcVar3 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x457,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_70.data_);
  }
  local_5c = CfdFreeHandle(local_30);
  local_70.data_ = local_70.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_50,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_5c);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x45d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, BlindDestroyAmountTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static const char* base_tx = "0200000000020fd1d25bb34f2fb499304dec92571f88f553891aceda376533fb8d76fc64b0ea0000000000ffffffffd2b787c00072aa8a46bf77d04017cfc73665fc2a3945af0ac43ef2ed2eca1e4a0100000000ffffffff0301c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d20100000000000f424000016a0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000001c7bd3d0980d0c7932a215d0444536159ff4d238f9c852659813df784505809d201000000000000000003edd71a5d0cd1e82e48ec3e26bfbfecb053b2a196e3ce56752312cc81e7eaca72016a00000000";

  char* tx_string = nullptr;
  int64_t satoshi;
  void* blind_handle = nullptr;
  ret = CfdInitializeBlindTx(handle, &blind_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    satoshi = 1000000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "eab064fc768dfb336537dace1a8953f5881f5792ec4d3099b42f4fb35bd2d10f", 0,
        "d209585084f73d815926859c8f234dff59615344045d212a93c7d080093dbdc7",
        "44c2852117c44c7a43833d5a681f09ec6120d889bb70891627d30a122ff24047",
        "3a2916b1ddd3514b32c533116e02b1262fc9df455df55d82a30197f4a81e9580",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 10000;
    ret = CfdAddBlindTxInData(
        handle, blind_handle,
        "4a1eca2eedf23ec40aaf45392afc6536c7cf1740d077bf468aaa7200c087b7d2", 1,
        "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
        "7afdad5199ae3427783bca4e392ece8525431ec3345d08e231de7fa6bd4938ab",
        "32633edc9ed7acc9407935db0820921abdc446a7c0c0203d279740fc0b26425b",
        satoshi, nullptr, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeBlindTx(handle, blind_handle, base_tx, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STRNE(base_tx, tx_string);
  }

  if (blind_handle != nullptr) {
    CfdFreeBlindHandle(handle, blind_handle);
  }

  CfdFreeStringBuffer(tx_string);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}